

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)304>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *featureDesc;
  int index;
  ModelDescription *pMVar2;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Result::Result(__return_storage_ptr__);
  pMVar2 = format->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (0 < (pMVar2->input_).super_RepeatedPtrFieldBase.current_size_) {
    index = 0;
    do {
      featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (&(pMVar2->input_).super_RepeatedPtrFieldBase,index);
      validateSchemaTypesIsMultiArray
                ((Result *)local_58,featureDesc,ArrayFeatureType_ArrayDataType_INT32,1,2);
      __return_storage_ptr__->m_type = local_58._0_4_;
      __return_storage_ptr__->m_reason = local_58._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      bVar1 = Result::good(__return_storage_ptr__);
    } while ((bVar1) &&
            (index = index + 1, index < (pMVar2->input_).super_RepeatedPtrFieldBase.current_size_));
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_bayesianProbitRegressor>(const Specification::Model& format) {
        Result result;
        const auto& description = format.description();
        const auto& inputFeatures = description.input();
        for (int i = 0; i < inputFeatures.size(); i++) {
            const auto& featureDesc = inputFeatures[i];
            result = validateSchemaTypesIsMultiArray(featureDesc, Specification::ArrayFeatureType_ArrayDataType_INT32, 1, 2);
            if (!result.good()) {
                return result;
            }
        }

        return result;
    }